

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Tools::string_split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *to_split,char *delimiters,char *to_trim)

{
  size_t sVar1;
  anon_union_16_2_ba345be5_for_m_Storage local_60;
  ulong local_50;
  anon_union_16_2_ba345be5_for_m_Storage local_48;
  ulong local_38;
  iterator_range<const_char_*> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = strlen(to_trim);
  local_30.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
       to_trim + sVar1;
  local_30.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       to_trim;
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_48,&local_30);
  boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (to_split,(is_any_ofF<char> *)&local_48);
  if ((0x10 < local_38) && (local_48.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_48.m_dynSet);
  }
  sVar1 = strlen(delimiters);
  local_30.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
       delimiters + sVar1;
  local_30.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       delimiters;
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_60,&local_30);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (__return_storage_ptr__,to_split,(is_any_ofF<char> *)&local_60,token_compress_on);
  if ((0x10 < local_50) && (local_60.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_60.m_dynSet);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Tools::string_split(std::string &to_split, const char *delimiters, const char *to_trim) {
    std::vector<std::string> results;
    boost::trim_if(to_split, boost::is_any_of(to_trim));
    boost::split(results, to_split, boost::is_any_of(delimiters), boost::token_compress_on);
    return results;
}